

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvlist.c
# Opt level: O1

nvlist_t * nvlist_get_pararr(nvlist_t *nvl,void **cookiep)

{
  nvlist_t *pnVar1;
  
  pnVar1 = nvlist_get_array_next(nvl);
  if (pnVar1 != (nvlist_t *)0x0) {
    if (cookiep != (void **)0x0) {
      *cookiep = (void *)0x0;
    }
    return pnVar1;
  }
  pnVar1 = nvlist_get_parent(nvl,cookiep);
  return pnVar1;
}

Assistant:

const nvlist_t *
nvlist_get_pararr(const nvlist_t *nvl, void **cookiep)
{
	const nvlist_t *ret;

	ret = nvlist_get_array_next(nvl);
	if (ret != NULL) {
		if (cookiep != NULL)
			*cookiep = NULL;
		return (ret);
	}

	return (nvlist_get_parent(nvl, cookiep));
}